

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::BatchedMatMulLayerParams
          (BatchedMatMulLayerParams *this,BatchedMatMulLayerParams *from)

{
  WeightParams *pWVar1;
  uint64_t uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  WeightParams *pWVar6;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BatchedMatMulLayerParams_003ff2f0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  pWVar1 = from->weights_;
  if (pWVar1 == (WeightParams *)0x0 ||
      from == (BatchedMatMulLayerParams *)_BatchedMatMulLayerParams_default_instance_) {
    pWVar6 = (WeightParams *)0x0;
  }
  else {
    pWVar6 = (WeightParams *)operator_new(0x48);
    WeightParams::WeightParams(pWVar6,pWVar1);
  }
  this->weights_ = pWVar6;
  pWVar1 = from->bias_;
  if (pWVar1 == (WeightParams *)0x0 ||
      from == (BatchedMatMulLayerParams *)_BatchedMatMulLayerParams_default_instance_) {
    pWVar6 = (WeightParams *)0x0;
  }
  else {
    pWVar6 = (WeightParams *)operator_new(0x48);
    WeightParams::WeightParams(pWVar6,pWVar1);
  }
  this->bias_ = pWVar6;
  uVar2 = from->weightmatrixseconddimension_;
  this->weightmatrixfirstdimension_ = from->weightmatrixfirstdimension_;
  this->weightmatrixseconddimension_ = uVar2;
  bVar3 = from->transposeb_;
  bVar4 = from->hasbias_;
  bVar5 = from->int8dynamicquantize_;
  this->transposea_ = from->transposea_;
  this->transposeb_ = bVar3;
  this->hasbias_ = bVar4;
  this->int8dynamicquantize_ = bVar5;
  return;
}

Assistant:

BatchedMatMulLayerParams::BatchedMatMulLayerParams(const BatchedMatMulLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_weights()) {
    weights_ = new ::CoreML::Specification::WeightParams(*from.weights_);
  } else {
    weights_ = nullptr;
  }
  if (from._internal_has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = nullptr;
  }
  ::memcpy(&weightmatrixfirstdimension_, &from.weightmatrixfirstdimension_,
    static_cast<size_t>(reinterpret_cast<char*>(&int8dynamicquantize_) -
    reinterpret_cast<char*>(&weightmatrixfirstdimension_)) + sizeof(int8dynamicquantize_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BatchedMatMulLayerParams)
}